

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_format.cpp
# Opt level: O2

bool UnformatImage(string *path,Range range)

{
  bool bVar1;
  int def_cyls;
  int def_heads;
  shared_ptr<Disk> disk;
  Range range_local;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  range_local._8_8_ = range._8_8_;
  range_local._0_8_ = range._0_8_;
  std::make_shared<Disk>();
  bVar1 = ReadImage(path,&disk,true);
  if (bVar1) {
    def_cyls = Disk::cyls(disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    def_heads = Disk::heads(disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    ValidateRange(&range_local,0x80,2,1,def_cyls,def_heads);
    local_38._8_8_ = 0;
    local_20 = std::
               _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/cmd_format.cpp:87:16)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/cmd_format.cpp:87:16)>
               ::_M_manager;
    local_38._M_unused._M_object = &disk;
    Range::each(&range_local,(function<void_(const_CylHead_&)> *)&local_38,false);
    std::_Function_base::~_Function_base((_Function_base *)&local_38);
    bVar1 = WriteImage(path,&disk);
  }
  else {
    bVar1 = false;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return bVar1;
}

Assistant:

bool UnformatImage(const std::string& path, Range range)
{
    auto disk = std::make_shared<Disk>();
    if (!ReadImage(path, disk))
        return false;

    ValidateRange(range, MAX_TRACKS, MAX_SIDES, 1, disk->cyls(), disk->heads());

    range.each([&](const CylHead& cylhead) {
        Message(msgStatus, "Unformatting %s", CH(cylhead.cyl, cylhead.head));
        disk->write(cylhead, Track());
        });

    return WriteImage(path, disk);
}